

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary.cpp
# Opt level: O2

bool __thiscall Arbitrarydeque::Run(Arbitrarydeque *this)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  difference_type __d;
  size_t generation;
  bool bVar4;
  allocator_type local_179;
  vector<std::deque<int,_std::allocator<int>_>,_std::allocator<std::deque<int,_std::allocator<int>_>_>_>
  vv;
  deque<int,_std::allocator<int>_> v;
  _Deque_base<int,_std::allocator<int>_> local_108;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  _Deque_iterator<int,_const_int_&,_const_int_*> local_98;
  _Deque_iterator<int,_const_int_&,_const_int_*> local_78;
  _Deque_iterator<int,_const_int_&,_const_int_*> local_58;
  _Deque_iterator<int,_const_int_&,_const_int_*> local_38;
  
  std::_Deque_base<int,_std::allocator<int>_>::_Deque_base
            (&v.super__Deque_base<int,_std::allocator<int>_>);
  for (generation = 1; generation != 6; generation = generation + 1) {
    local_108._M_impl.super__Deque_impl_data._M_map._0_4_ =
         testinator::detail::Arbitrary_Arithmetic<int>::generate(generation,generation - 1);
    std::deque<int,_std::allocator<int>_>::emplace_back<int>
              ((deque<int,_std::allocator<int>_> *)&v.super__Deque_base<int,_std::allocator<int>_>,
               (int *)&local_108);
  }
  vv.
  super__Vector_base<std::deque<int,_std::allocator<int>_>,_std::allocator<std::deque<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vv.
  super__Vector_base<std::deque<int,_std::allocator<int>_>,_std::allocator<std::deque<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vv.
  super__Vector_base<std::deque<int,_std::allocator<int>_>,_std::allocator<std::deque<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (v.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish._M_cur
      != (_Elt_pointer)
         CONCAT44(v.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                  _M_start._M_cur._4_4_,
                  v.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                  _M_start._M_cur._0_4_)) {
    sVar1 = std::deque<int,_std::allocator<int>_>::size(&v);
    local_b8 = v.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
               _M_start._M_cur._0_4_;
    uStack_b4 = v.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_start._M_cur._4_4_;
    uStack_b0 = v.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_start._M_first._0_4_;
    uStack_ac = v.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_start._M_first._4_4_;
    local_a8 = v.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
               _M_start._M_last._0_4_;
    uStack_a4 = v.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_start._M_last._4_4_;
    uStack_a0 = v.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_start._M_node._0_4_;
    uStack_9c = v.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_start._M_node._4_4_;
    std::__advance<std::_Deque_iterator<int,int_const&,int_const*>,long>(&local_b8,sVar1 >> 1);
    local_58._M_cur = (_Elt_pointer)CONCAT44(uStack_b4,local_b8);
    local_58._M_first = (_Elt_pointer)CONCAT44(uStack_ac,uStack_b0);
    local_58._M_last = (_Elt_pointer)CONCAT44(uStack_a4,local_a8);
    local_58._M_node = (_Map_pointer)CONCAT44(uStack_9c,uStack_a0);
    std::deque<int,std::allocator<int>>::deque<std::_Deque_iterator<int,int_const&,int_const*>,void>
              ((deque<int,std::allocator<int>> *)&local_108,&local_38,&local_58,
               (allocator_type *)&local_98);
    std::
    vector<std::deque<int,std::allocator<int>>,std::allocator<std::deque<int,std::allocator<int>>>>
    ::emplace_back<std::deque<int,std::allocator<int>>>
              ((vector<std::deque<int,std::allocator<int>>,std::allocator<std::deque<int,std::allocator<int>>>>
                *)&vv,(deque<int,_std::allocator<int>_> *)&local_108);
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_108);
    if (1 < sVar1) {
      local_98._M_cur = (_Elt_pointer)CONCAT44(uStack_b4,local_b8);
      local_98._M_first = (_Elt_pointer)CONCAT44(uStack_ac,uStack_b0);
      local_98._M_last = (_Elt_pointer)CONCAT44(uStack_a4,local_a8);
      local_98._M_node = (_Map_pointer)CONCAT44(uStack_9c,uStack_a0);
      local_78._M_cur =
           v.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
           _M_cur;
      local_78._M_first =
           v.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
           _M_first;
      local_78._M_last =
           v.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
           _M_last;
      local_78._M_node =
           v.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
           _M_node;
      std::deque<int,std::allocator<int>>::
      deque<std::_Deque_iterator<int,int_const&,int_const*>,void>
                ((deque<int,std::allocator<int>> *)&local_108,&local_98,&local_78,&local_179);
      std::
      vector<std::deque<int,std::allocator<int>>,std::allocator<std::deque<int,std::allocator<int>>>>
      ::emplace_back<std::deque<int,std::allocator<int>>>
                ((vector<std::deque<int,std::allocator<int>>,std::allocator<std::deque<int,std::allocator<int>>>>
                  *)&vv,(deque<int,_std::allocator<int>_> *)&local_108);
      std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_108);
    }
  }
  if ((long)vv.
            super__Vector_base<std::deque<int,_std::allocator<int>_>,_std::allocator<std::deque<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)vv.
            super__Vector_base<std::deque<int,_std::allocator<int>_>,_std::allocator<std::deque<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0xa0) {
    sVar1 = std::deque<int,_std::allocator<int>_>::size
                      (vv.
                       super__Vector_base<std::deque<int,_std::allocator<int>_>,_std::allocator<std::deque<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    sVar2 = std::deque<int,_std::allocator<int>_>::size
                      (vv.
                       super__Vector_base<std::deque<int,_std::allocator<int>_>,_std::allocator<std::deque<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
    sVar3 = std::deque<int,_std::allocator<int>_>::size(&v);
    bVar4 = sVar2 + sVar1 == sVar3;
  }
  else {
    bVar4 = false;
  }
  std::
  vector<std::deque<int,_std::allocator<int>_>,_std::allocator<std::deque<int,_std::allocator<int>_>_>_>
  ::~vector(&vv);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&v.super__Deque_base<int,_std::allocator<int>_>);
  return bVar4;
}

Assistant:

DEF_TEST(deque, Arbitrary)
{
  testinator::Arbitrary<deque<int>> a;
  deque<int> v = a.generate(1,0);
  vector<deque<int>> vv = a.shrink(v);
  return vv.size() == 2
    && vv[0].size() + vv[1].size() == v.size();
}